

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int mbedtls_x509_crt_is_revoked(mbedtls_x509_crt *crt,mbedtls_x509_crl *crl)

{
  size_t sVar1;
  size_t __n;
  int iVar2;
  mbedtls_x509_crl_entry *pmVar3;
  
  pmVar3 = &crl->entry;
  while( true ) {
    sVar1 = (pmVar3->serial).len;
    if (sVar1 == 0) {
      return 0;
    }
    __n = (crt->serial).len;
    if (((__n == sVar1) && (iVar2 = bcmp((crt->serial).p,(pmVar3->serial).p,__n), iVar2 == 0)) &&
       (iVar2 = mbedtls_x509_time_is_past(&pmVar3->revocation_date), iVar2 != 0)) break;
    pmVar3 = pmVar3->next;
    if (pmVar3 == (mbedtls_x509_crl_entry *)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int mbedtls_x509_crt_is_revoked( const mbedtls_x509_crt *crt, const mbedtls_x509_crl *crl )
{
    const mbedtls_x509_crl_entry *cur = &crl->entry;

    while( cur != NULL && cur->serial.len != 0 )
    {
        if( crt->serial.len == cur->serial.len &&
            memcmp( crt->serial.p, cur->serial.p, crt->serial.len ) == 0 )
        {
            if( mbedtls_x509_time_is_past( &cur->revocation_date ) )
                return( 1 );
        }

        cur = cur->next;
    }

    return( 0 );
}